

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::Action<void_(unsigned_short,_unsigned_short)>::Perform
          (Action<void_(unsigned_short,_unsigned_short)> *this,ArgumentTuple *args)

{
  bool bVar1;
  ActionInterface<void_(unsigned_short,_unsigned_short)> *pAVar2;
  ArgumentTuple *args_local;
  Action<void_(unsigned_short,_unsigned_short)> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O0/_deps/googletest-src/googlemock/include/gmock/gmock-actions.h"
               ,0x193);
  }
  bVar1 = std::operator!=(&this->fun_,(nullptr_t)0x0);
  if (bVar1) {
    internal::
    Apply<std::function<void(unsigned_short,unsigned_short)>const&,std::tuple<unsigned_short,unsigned_short>>
              (&this->fun_,args);
  }
  else {
    pAVar2 = internal::linked_ptr<testing::ActionInterface<void_(unsigned_short,_unsigned_short)>_>
             ::operator->(&this->impl_);
    (**(code **)(*(long *)pAVar2 + 0x10))(pAVar2,args);
  }
  return;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
#if GTEST_LANG_CXX11
    if (fun_ != nullptr) {
      return internal::Apply(fun_, ::std::move(args));
    }
#endif
    return impl_->Perform(args);
  }